

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::iterate
          (BasicVariousTessLevelsPosAttrCase *this)

{
  string *this_00;
  SpacingMode mode;
  TestLog *log;
  RenderContext *rCtx;
  code *pcVar1;
  Archive *archive;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  ChannelType CVar8;
  TessPrimitiveType TVar9;
  ConstPixelBufferAccess *__return_storage_ptr__;
  int i;
  long lVar10;
  int local_2bc;
  ChannelType local_2b8;
  deUint32 local_2b4;
  float innerLevels [2];
  float outerLevels [4];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  undefined1 local_248 [40];
  Surface rendered;
  RandomViewport viewport;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  VertexArrayBinding attrBindings [1];
  undefined4 extraout_var_00;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  rCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*rCtx->_vptr_RenderContext[4])(rCtx);
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  __return_storage_ptr__ = (ConstPixelBufferAccess *)(ulong)dVar4;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x100,0x100,dVar4);
  dVar4 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar3 = (*rCtx->_vptr_RenderContext[3])(rCtx);
  lVar6 = CONCAT44(extraout_var_00,iVar3);
  TVar9 = this->m_primitiveType;
  if (TVar9 == TESSPRIMITIVETYPE_TRIANGLES) {
    CVar8 = UNORM_INT8;
  }
  else if (TVar9 == TESSPRIMITIVETYPE_QUADS) {
    CVar8 = UNORM_INT16;
  }
  else {
    CVar8 = (uint)(TVar9 == TESSPRIMITIVETYPE_ISOLINES) * 5 - SNORM_INT16;
  }
  (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x1680))(dVar4);
  (**(code **)(lVar6 + 0xfd8))(0x8e72);
  local_2bc = 0;
  local_2b8 = CVar8;
  local_2b4 = dVar4;
  while( true ) {
    if (2 < local_2bc) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    mode = this->m_spacing;
    lVar7 = (long)local_2bc;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      iVar3 = getClampedRoundedTessLevel(mode,iterate::tessLevelCases[lVar7].inner[lVar10]);
      innerLevels[lVar10] = (float)iVar3;
    }
    for (lVar10 = 0; TVar9 = (TessPrimitiveType)__return_storage_ptr__, lVar10 != 4;
        lVar10 = lVar10 + 1) {
      iVar3 = getClampedRoundedTessLevel(mode,*(float *)(lVar7 * 0x18 + 0x1889f18 + lVar10 * 4));
      outerLevels[lVar10] = (float)iVar3;
    }
    this_00 = &attrBindings[0].binding.name;
    attrBindings[0].binding._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Tessellation levels: ");
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)local_248,(_anonymous_namespace_ *)innerLevels,outerLevels,
               (float *)(ulong)this->m_primitiveType,TVar9);
    dVar4 = local_2b4;
    std::operator<<((ostream *)&attrBindings[0].binding.name,(string *)local_248);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)attrBindings,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&attrBindings[0].binding.name);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelInner0");
    (*pcVar1)(innerLevels[0],uVar5);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelInner1");
    (*pcVar1)(innerLevels[1],uVar5);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelOuter0");
    (*pcVar1)(outerLevels[0],uVar5);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelOuter1");
    (*pcVar1)(outerLevels[1],uVar5);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelOuter2");
    (*pcVar1)(outerLevels[2],uVar5);
    pcVar1 = *(code **)(lVar6 + 0x14e0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar4,"u_tessLevelOuter3");
    (*pcVar1)(outerLevels[3],uVar5);
    (**(code **)(lVar6 + 0x188))(0x4000);
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              (&positions,4);
    if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
      attrBindings[0].binding.type = 0xbf4ccccd;
      attrBindings[0].binding._4_4_ = 0xbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
      attrBindings[0].binding.type = 0x3f4ccccd;
      attrBindings[0].binding._4_4_ = 0xbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
      attrBindings[0].binding.type = 0xbf4ccccd;
      attrBindings[0].binding._4_4_ = 0x3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
      attrBindings[0].binding.type = 0x3f4ccccd;
      attrBindings[0].binding._4_4_ = 0x3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
    }
    else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      attrBindings[0].binding.type = 0x3f4ccccd;
      attrBindings[0].binding._4_4_ = 0x3f19999a;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
      attrBindings[0].binding.type = TYPE_LOCATION;
      attrBindings[0].binding._4_4_ = 0xbf49374c;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
      attrBindings[0].binding.type = 0xbf4ccccd;
      attrBindings[0].binding._4_4_ = 0x3f19999a;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&positions,
                 (Vector<float,_2> *)attrBindings);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,"in_v_position",(allocator<char> *)&local_1f8);
    glu::va::Float(attrBindings,(string *)local_248,2,
                   (int)((ulong)((long)positions.
                                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)positions.
                                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),0,
                   (positions.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data);
    std::__cxx11::string::~string((string *)local_248);
    local_248._0_4_ = RGB;
    local_248._4_4_ = local_2b8;
    local_248._8_4_ = 3;
    local_248._16_8_ = 0;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar4,1,attrBindings,
              (PrimitiveList *)local_248,(DrawUtilCallback *)0x0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x98d);
    std::__cxx11::string::~string((string *)&attrBindings[0].binding.name);
    std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &positions);
    getPixels(&rendered,rCtx,&viewport);
    archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
    std::operator+(&local_1f8,&this->m_referenceImagePathPrefix,"_");
    de::toString<int>(&local_1d8,&local_2bc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&positions,
                   &local_1f8,&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&positions,
                   ".png");
    getPNG((TextureLevel *)attrBindings,archive,(string *)local_248);
    std::__cxx11::string::~string((string *)local_248);
    __return_storage_ptr__ = (ConstPixelBufferAccess *)&positions;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_248,(TextureLevel *)attrBindings);
    tcu::Surface::getAccess(__return_storage_ptr__,&rendered);
    bVar2 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",
                              (ConstPixelBufferAccess *)local_248,__return_storage_ptr__,0.002,
                              COMPARE_LOG_RESULT);
    if (!bVar2) break;
    tcu::TextureLevel::~TextureLevel((TextureLevel *)attrBindings);
    tcu::Surface::~Surface(&rendered);
    local_2bc = local_2bc + 1;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Image comparison failed");
  tcu::TextureLevel::~TextureLevel((TextureLevel *)attrBindings);
  tcu::Surface::~Surface(&rendered);
  return STOP;
}

Assistant:

BasicVariousTessLevelsPosAttrCase::IterateResult BasicVariousTessLevelsPosAttrCase::iterate (void)
{
	static const struct
	{
		float inner[2];
		float outer[4];
	} tessLevelCases[] =
	{
		{ { 9.0f,	9.0f	},	{ 9.0f,		9.0f,	9.0f,	9.0f	} },
		{ { 8.0f,	11.0f	},	{ 13.0f,	15.0f,	18.0f,	21.0f	} },
		{ { 17.0f,	14.0f	},	{ 3.0f,		6.0f,	9.0f,	12.0f	} }
	};

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32			programGL			= m_program->getProgram();
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				patchSize			= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES	? 3
												: m_primitiveType == TESSPRIMITIVETYPE_QUADS		? 4
												: m_primitiveType == TESSPRIMITIVETYPE_ISOLINES		? 4
												: -1;

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, patchSize);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < DE_LENGTH_OF_ARRAY(tessLevelCases); tessLevelCaseNdx++)
	{
		float innerLevels[2];
		float outerLevels[4];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(innerLevels); i++)
			innerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].inner[i]);

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(outerLevels); i++)
			outerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].outer[i]);

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(&innerLevels[0], &outerLevels[0], m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner0"), innerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner1"), innerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter0"), outerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter1"), outerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter2"), outerLevels[2]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter3"), outerLevels[3]);

		gl.clear(GL_COLOR_BUFFER_BIT);

		{
			vector<Vec2> positions;
			positions.reserve(4);

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			{
				positions.push_back(Vec2( 0.8f,    0.6f));
				positions.push_back(Vec2( 0.0f, -0.786f));
				positions.push_back(Vec2(-0.8f,    0.6f));
			}
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			{
				positions.push_back(Vec2(-0.8f, -0.8f));
				positions.push_back(Vec2( 0.8f, -0.8f));
				positions.push_back(Vec2(-0.8f,  0.8f));
				positions.push_back(Vec2( 0.8f,  0.8f));
			}
			else
				DE_ASSERT(false);

			DE_ASSERT((int)positions.size() == patchSize);

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("in_v_position", 2, (int)positions.size(), 0, &positions[0].x())
			};

			glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Patches(patchSize));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		}

		{
			const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePathPrefix + "_" + de::toString(tessLevelCaseNdx) + ".png");
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.002f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}